

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O3

void nn_ctcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  size_t addrlen;
  int iVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  size_t addrlen_00;
  long lVar5;
  int extraout_EDX;
  void **ppvVar6;
  nn_ep *pnVar7;
  sockaddr *psVar8;
  byte bVar9;
  int val;
  int ipv4only;
  size_t locallen;
  size_t ipv4onlylen;
  sockaddr_storage local;
  undefined1 auStack_158 [4];
  int local_154;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  sockaddr_storage local_138;
  sockaddr local_b0 [8];
  
  bVar9 = 0;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_00158655:
        nn_ctcp_start_resolving((nn_ctcp *)self);
        return;
      }
      src = type;
      nn_ctcp_handler_cold_24();
      type = extraout_EDX;
      goto switchD_001583d2_caseD_5;
    }
LAB_001588b3:
    nn_ctcp_handler_cold_23();
LAB_001588b8:
    nn_ctcp_handler_cold_21();
LAB_001588bd:
    nn_ctcp_handler_cold_7();
LAB_001588c2:
    nn_ctcp_handler_cold_5();
LAB_001588c7:
    nn_ctcp_handler_cold_1();
    break;
  case 2:
    if (src != 3) goto LAB_001588b8;
    if (type == 1) {
      nn_dns_stop((nn_dns *)&self[0x16].owner);
      *(undefined4 *)&self[1].fn = 3;
      return;
    }
    goto LAB_001588e1;
  case 3:
    if (src != 3) goto LAB_001588a4;
    if (type == 2) {
      if (self[0x1a].stopped.src != 0) goto LAB_0015862b;
      addrlen._0_4_ = self[0x1c].state;
      addrlen._4_4_ = self[0x1c].src;
      __s = nn_ep_getaddr((nn_ep *)self[1].shutdown_fn);
      sVar3 = strlen(__s);
      pcVar4 = strrchr(__s,0x3a);
      iVar1 = nn_port_resolve(pcVar4 + 1,(size_t)(__s + ~(ulong)pcVar4 + sVar3));
      if (iVar1 < 1) {
        nn_ctcp_handler_cold_20();
LAB_0015888b:
        nn_ctcp_handler_cold_15();
LAB_00158890:
        nn_ctcp_handler_cold_16();
LAB_00158895:
        nn_ctcp_handler_cold_17();
      }
      else {
        local_140 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,0xe,&local_154,&local_140);
        if (local_140 != 4) goto LAB_0015888b;
        pcVar4 = strchr(__s,0x3b);
        local_138.ss_family = 0;
        local_138.__ss_padding[0] = '\0';
        local_138.__ss_padding[1] = '\0';
        local_138.__ss_padding[2] = '\0';
        local_138.__ss_padding[3] = '\0';
        local_138.__ss_padding[4] = '\0';
        local_138.__ss_padding[5] = '\0';
        local_138.__ss_padding[6] = '\0';
        local_138.__ss_padding[7] = '\0';
        local_138.__ss_padding[8] = '\0';
        local_138.__ss_padding[9] = '\0';
        local_138.__ss_padding[10] = '\0';
        local_138.__ss_padding[0xb] = '\0';
        local_138.__ss_padding[0xc] = '\0';
        local_138.__ss_padding[0xd] = '\0';
        local_138.__ss_padding[0xe] = '\0';
        local_138.__ss_padding[0xf] = '\0';
        local_138.__ss_padding[0x10] = '\0';
        local_138.__ss_padding[0x11] = '\0';
        local_138.__ss_padding[0x12] = '\0';
        local_138.__ss_padding[0x13] = '\0';
        local_138.__ss_padding[0x14] = '\0';
        local_138.__ss_padding[0x15] = '\0';
        local_138.__ss_padding[0x16] = '\0';
        local_138.__ss_padding[0x17] = '\0';
        local_138.__ss_padding[0x18] = '\0';
        local_138.__ss_padding[0x19] = '\0';
        local_138.__ss_padding[0x1a] = '\0';
        local_138.__ss_padding[0x1b] = '\0';
        local_138.__ss_padding[0x1c] = '\0';
        local_138.__ss_padding[0x1d] = '\0';
        local_138.__ss_padding[0x1e] = '\0';
        local_138.__ss_padding[0x1f] = '\0';
        local_138.__ss_padding[0x20] = '\0';
        local_138.__ss_padding[0x21] = '\0';
        local_138.__ss_padding[0x22] = '\0';
        local_138.__ss_padding[0x23] = '\0';
        local_138.__ss_padding[0x24] = '\0';
        local_138.__ss_padding[0x25] = '\0';
        local_138.__ss_padding[0x26] = '\0';
        local_138.__ss_padding[0x27] = '\0';
        local_138.__ss_padding[0x28] = '\0';
        local_138.__ss_padding[0x29] = '\0';
        local_138.__ss_padding[0x2a] = '\0';
        local_138.__ss_padding[0x2b] = '\0';
        local_138.__ss_padding[0x2c] = '\0';
        local_138.__ss_padding[0x2d] = '\0';
        local_138.__ss_padding[0x2e] = '\0';
        local_138.__ss_padding[0x2f] = '\0';
        local_138.__ss_padding[0x30] = '\0';
        local_138.__ss_padding[0x31] = '\0';
        local_138.__ss_padding[0x32] = '\0';
        local_138.__ss_padding[0x33] = '\0';
        local_138.__ss_padding[0x34] = '\0';
        local_138.__ss_padding[0x35] = '\0';
        local_138.__ss_padding[0x36] = '\0';
        local_138.__ss_padding[0x37] = '\0';
        local_138.__ss_padding[0x38] = '\0';
        local_138.__ss_padding[0x39] = '\0';
        local_138.__ss_padding[0x3a] = '\0';
        local_138.__ss_padding[0x3b] = '\0';
        local_138.__ss_padding[0x3c] = '\0';
        local_138.__ss_padding[0x3d] = '\0';
        local_138.__ss_padding[0x3e] = '\0';
        local_138.__ss_padding[0x3f] = '\0';
        local_138.__ss_padding[0x40] = '\0';
        local_138.__ss_padding[0x41] = '\0';
        local_138.__ss_padding[0x42] = '\0';
        local_138.__ss_padding[0x43] = '\0';
        local_138.__ss_padding[0x44] = '\0';
        local_138.__ss_padding[0x45] = '\0';
        local_138.__ss_padding[0x46] = '\0';
        local_138.__ss_padding[0x47] = '\0';
        local_138.__ss_padding[0x48] = '\0';
        local_138.__ss_padding[0x49] = '\0';
        local_138.__ss_padding[0x4a] = '\0';
        local_138.__ss_padding[0x4b] = '\0';
        local_138.__ss_padding[0x4c] = '\0';
        local_138.__ss_padding[0x4d] = '\0';
        local_138.__ss_padding[0x4e] = '\0';
        local_138.__ss_padding[0x4f] = '\0';
        local_138.__ss_padding[0x50] = '\0';
        local_138.__ss_padding[0x51] = '\0';
        local_138.__ss_padding[0x52] = '\0';
        local_138.__ss_padding[0x53] = '\0';
        local_138.__ss_padding[0x54] = '\0';
        local_138.__ss_padding[0x55] = '\0';
        local_138.__ss_padding[0x56] = '\0';
        local_138.__ss_padding[0x57] = '\0';
        local_138.__ss_padding[0x58] = '\0';
        local_138.__ss_padding[0x59] = '\0';
        local_138.__ss_padding[0x5a] = '\0';
        local_138.__ss_padding[0x5b] = '\0';
        local_138.__ss_padding[0x5c] = '\0';
        local_138.__ss_padding[0x5d] = '\0';
        local_138.__ss_padding[0x5e] = '\0';
        local_138.__ss_padding[0x5f] = '\0';
        local_138.__ss_padding[0x60] = '\0';
        local_138.__ss_padding[0x61] = '\0';
        local_138.__ss_padding[0x62] = '\0';
        local_138.__ss_padding[99] = '\0';
        local_138.__ss_padding[100] = '\0';
        local_138.__ss_padding[0x65] = '\0';
        local_138.__ss_padding[0x66] = '\0';
        local_138.__ss_padding[0x67] = '\0';
        local_138.__ss_padding[0x68] = '\0';
        local_138.__ss_padding[0x69] = '\0';
        local_138.__ss_padding[0x6a] = '\0';
        local_138.__ss_padding[0x6b] = '\0';
        local_138.__ss_padding[0x6c] = '\0';
        local_138.__ss_padding[0x6d] = '\0';
        local_138.__ss_padding[0x6e] = '\0';
        local_138.__ss_padding[0x6f] = '\0';
        local_138.__ss_padding[0x70] = '\0';
        local_138.__ss_padding[0x71] = '\0';
        local_138.__ss_padding[0x72] = '\0';
        local_138.__ss_padding[0x73] = '\0';
        local_138.__ss_padding[0x74] = '\0';
        local_138.__ss_padding[0x75] = '\0';
        local_138.__ss_align = 0;
        if (pcVar4 == (char *)0x0) {
          __s = "*";
          addrlen_00 = 1;
        }
        else {
          addrlen_00 = (long)pcVar4 - (long)__s;
        }
        iVar2 = nn_iface_resolve(__s,addrlen_00,local_154,&local_138,&local_148);
        if (iVar2 < 0) {
LAB_0015862b:
          nn_backoff_start((nn_backoff *)&self[8].shutdown_fn);
          *(undefined4 *)&self[1].fn = 8;
          return;
        }
        ppvVar6 = &self[0x1a].stopped.srcptr;
        psVar8 = local_b0;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(void **)psVar8 = *ppvVar6;
          ppvVar6 = ppvVar6 + (ulong)bVar9 * -2 + 1;
          psVar8 = (sockaddr *)(psVar8[-(ulong)bVar9].sa_data + 6);
        }
        if ((local_b0[0].sa_family | 8) != 10) goto LAB_00158909;
        local_b0[0].sa_data._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
        self_00 = &self[1].state;
        iVar1 = nn_usock_start((nn_usock *)self_00,(uint)local_b0[0].sa_family,1,0);
        if (iVar1 < 0) goto LAB_0015862b;
        local_150 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,2,auStack_158,&local_150);
        if (local_150 != 4) goto LAB_00158890;
        nn_usock_setsockopt((nn_usock *)self_00,1,7,auStack_158,4);
        local_150 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,3,auStack_158,&local_150);
        if (local_150 != 4) goto LAB_00158895;
        nn_usock_setsockopt((nn_usock *)self_00,1,8,auStack_158,4);
        local_150 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,-3,1,auStack_158,&local_150);
        if (local_150 == 4) {
          nn_usock_setsockopt((nn_usock *)self_00,6,1,auStack_158,4);
          iVar1 = nn_usock_bind((nn_usock *)self_00,(sockaddr *)&local_138,local_148);
          if (iVar1 == 0) {
            nn_usock_connect((nn_usock *)self_00,local_b0,addrlen);
            *(undefined4 *)&self[1].fn = 4;
            nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,1);
            return;
          }
          goto LAB_0015862b;
        }
      }
      nn_ctcp_handler_cold_18();
      goto LAB_0015889f;
    }
    goto LAB_001588d3;
  case 4:
    if (src != 1) goto LAB_001588a9;
    if (type == 5) {
      pnVar7 = (nn_ep *)self[1].shutdown_fn;
      iVar1 = nn_usock_geterrno((nn_usock *)&self[1].state);
      nn_ep_set_error(pnVar7,iVar1);
      nn_usock_stop((nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 7;
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,-1);
      pnVar7 = (nn_ep *)self[1].shutdown_fn;
      iVar1 = 0x69;
      goto LAB_001586b3;
    }
    if (type == 1) {
      nn_stcp_start((nn_stcp *)&self[10].stopped.item,(nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 5;
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0xca,-1);
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x65,1);
      nn_ep_clear_error((nn_ep *)self[1].shutdown_fn);
      return;
    }
    goto LAB_001588f4;
  case 5:
switchD_001583d2_caseD_5:
    if (src != 4) {
LAB_0015889f:
      nn_ctcp_handler_cold_9();
LAB_001588a4:
      nn_ctcp_handler_cold_13();
LAB_001588a9:
      nn_ctcp_handler_cold_11();
LAB_001588ae:
      nn_ctcp_handler_cold_3();
      goto LAB_001588b3;
    }
    if (type == 1) {
      nn_stcp_stop((nn_stcp *)&self[10].stopped.item);
      *(undefined4 *)&self[1].fn = 6;
      pnVar7 = (nn_ep *)self[1].shutdown_fn;
      iVar1 = 0x68;
LAB_001586b3:
      nn_ep_stat_increment(pnVar7,iVar1,1);
      return;
    }
    break;
  case 6:
    if (src != 4) goto LAB_001588bd;
    if (type == 8) {
      return;
    }
    if (type == 2) {
      nn_usock_stop((nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 7;
      return;
    }
    goto LAB_001588fb;
  case 7:
    if (src != 1) goto LAB_001588c2;
    if (type == 8) {
      return;
    }
    if (type == 7) goto LAB_0015862b;
    goto LAB_00158902;
  case 8:
    if (src != 2) goto LAB_001588ae;
    if (type == 1) {
      nn_backoff_stop((nn_backoff *)&self[8].shutdown_fn);
      *(undefined4 *)&self[1].fn = 9;
      return;
    }
    goto LAB_001588da;
  case 9:
    if (src != 2) goto LAB_001588c7;
    if (type == 2) goto LAB_00158655;
    goto LAB_001588e8;
  default:
    goto switchD_001583d2_default;
  }
  nn_ctcp_handler_cold_10();
LAB_001588d3:
  nn_ctcp_handler_cold_14();
LAB_001588da:
  nn_ctcp_handler_cold_4();
LAB_001588e1:
  nn_ctcp_handler_cold_22();
LAB_001588e8:
  nn_ctcp_handler_cold_2();
switchD_001583d2_default:
  nn_ctcp_handler_cold_25();
LAB_001588f4:
  nn_ctcp_handler_cold_12();
LAB_001588fb:
  nn_ctcp_handler_cold_8();
LAB_00158902:
  nn_ctcp_handler_cold_6();
LAB_00158909:
  nn_ctcp_handler_cold_19();
}

Assistant:

static void nn_ctcp_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ctcp *ctcp;

    ctcp = nn_cont (self, struct nn_ctcp, fsm);

    switch (ctcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_CTCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_ctcp_start_resolving (ctcp);
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  RESOLVING state.                                                          */
/*  Name of the host to connect to is being resolved to get an IP address.    */
/******************************************************************************/
    case NN_CTCP_STATE_RESOLVING:
        switch (src) {

        case NN_CTCP_SRC_DNS:
            switch (type) {
            case NN_DNS_DONE:
                nn_dns_stop (&ctcp->dns);
                ctcp->state = NN_CTCP_STATE_STOPPING_DNS;
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_DNS state.                                                       */
/*  dns object was asked to stop but it haven't stopped yet.                  */
/******************************************************************************/
    case NN_CTCP_STATE_STOPPING_DNS:
        switch (src) {

        case NN_CTCP_SRC_DNS:
            switch (type) {
            case NN_DNS_STOPPED:
                if (ctcp->dns_result.error == 0) {
                    nn_ctcp_start_connecting (ctcp, &ctcp->dns_result.addr,
                        ctcp->dns_result.addrlen);
                    return;
                }
                nn_backoff_start (&ctcp->retry);
                ctcp->state = NN_CTCP_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  CONNECTING state.                                                         */
/*  Non-blocking connect is under way.                                        */
/******************************************************************************/
    case NN_CTCP_STATE_CONNECTING:
        switch (src) {

        case NN_CTCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_CONNECTED:
                nn_stcp_start (&ctcp->stcp, &ctcp->usock);
                ctcp->state = NN_CTCP_STATE_ACTIVE;
                nn_ep_stat_increment (ctcp->ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (ctcp->ep,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                nn_ep_clear_error (ctcp->ep);
                return;
            case NN_USOCK_ERROR:
                nn_ep_set_error (ctcp->ep, nn_usock_geterrno (&ctcp->usock));
                nn_usock_stop (&ctcp->usock);
                ctcp->state = NN_CTCP_STATE_STOPPING_USOCK;
                nn_ep_stat_increment (ctcp->ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (ctcp->ep, NN_STAT_CONNECT_ERRORS, 1);
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Connection is established and handled by the stcp state machine.          */
/******************************************************************************/
    case NN_CTCP_STATE_ACTIVE:
        switch (src) {

        case NN_CTCP_SRC_STCP:
            switch (type) {
            case NN_STCP_ERROR:
                nn_stcp_stop (&ctcp->stcp);
                ctcp->state = NN_CTCP_STATE_STOPPING_STCP;
                nn_ep_stat_increment (ctcp->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STCP state.                                                      */
/*  stcp object was asked to stop but it haven't stopped yet.                 */
/******************************************************************************/
    case NN_CTCP_STATE_STOPPING_STCP:
        switch (src) {

        case NN_CTCP_SRC_STCP:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_STCP_STOPPED:
                nn_usock_stop (&ctcp->usock);
                ctcp->state = NN_CTCP_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_CTCP_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_CTCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_backoff_start (&ctcp->retry);
                ctcp->state = NN_CTCP_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-connection is attempted. This way we won't overload     */
/*  the system by continuous re-connection attemps.                           */
/******************************************************************************/
    case NN_CTCP_STATE_WAITING:
        switch (src) {

        case NN_CTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&ctcp->retry);
                ctcp->state = NN_CTCP_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_CTCP_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_CTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_ctcp_start_resolving (ctcp);
                return;
            default:
                nn_fsm_bad_action (ctcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (ctcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (ctcp->state, src, type);
    }
}